

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O0

void __thiscall wasm::WasmBinaryWriter::writeInlineString(WasmBinaryWriter *this,string_view name)

{
  BufferWithRandomAccess *this_00;
  size_type sVar1;
  const_pointer data;
  U32LEB local_24;
  WasmBinaryWriter *local_20;
  WasmBinaryWriter *this_local;
  string_view name_local;
  
  name_local._M_len = (size_t)name._M_str;
  this_local = (WasmBinaryWriter *)name._M_len;
  this_00 = this->o;
  local_20 = this;
  sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  LEB<unsigned_int,_unsigned_char>::LEB(&local_24,(uint)sVar1);
  BufferWithRandomAccess::operator<<(this_00,local_24);
  data = std::basic_string_view<char,_std::char_traits<char>_>::data
                   ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  writeData(this,data,sVar1);
  return;
}

Assistant:

void WasmBinaryWriter::writeInlineString(std::string_view name) {
  o << U32LEB(name.size());
  writeData(name.data(), name.size());
}